

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

HighsStatus __thiscall
HighsSparseMatrix::assess
          (HighsSparseMatrix *this,HighsLogOptions *log_options,string *matrix_name,
          double small_matrix_value,double large_matrix_value)

{
  MatrixFormat MVar1;
  pointer pcVar2;
  HighsInt num_vec;
  HighsInt vec_dim;
  HighsStatus HVar3;
  string local_50;
  
  MVar1 = this->format_;
  num_vec = this->num_row_;
  vec_dim = this->num_col_;
  if (MVar1 == kColwise) {
    num_vec = this->num_col_;
    vec_dim = this->num_row_;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (matrix_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + matrix_name->_M_string_length);
  HVar3 = assessMatrix(log_options,&local_50,vec_dim,num_vec,MVar1 == kRowwisePartitioned,
                       &this->start_,&this->p_end_,&this->index_,&this->value_,small_matrix_value,
                       large_matrix_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return HVar3;
}

Assistant:

HighsStatus HighsSparseMatrix::assess(const HighsLogOptions& log_options,
                                      const std::string matrix_name,
                                      const double small_matrix_value,
                                      const double large_matrix_value) {
  assert(this->formatOk());
  // Identify main dimensions
  HighsInt vec_dim;
  HighsInt num_vec;
  if (this->isColwise()) {
    vec_dim = this->num_row_;
    num_vec = this->num_col_;
  } else {
    vec_dim = this->num_col_;
    num_vec = this->num_row_;
  }
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  return assessMatrix(log_options, matrix_name, vec_dim, num_vec, partitioned,
                      this->start_, this->p_end_, this->index_, this->value_,
                      small_matrix_value, large_matrix_value);
}